

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_servergreet_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  connectdata *conn_00;
  ulong __n;
  char *__s;
  char *src;
  size_t __n_00;
  void *pvVar1;
  char *at;
  size_t timestamplen;
  char *gt;
  char *lt;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  connectdata *conn;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  __s = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  __n = (data->conn->proto).ftpc.pp.nfinal;
  if (pop3code == 0x2b) {
    if (3 < __n) {
      timestamplen = 0;
      src = (char *)memchr(__s,0x3c,__n);
      if (src != (char *)0x0) {
        timestamplen = (size_t)memchr(src,0x3e,__n - ((long)src - (long)__s));
      }
      if (timestamplen != 0) {
        __n_00 = (timestamplen - (long)src) + 1;
        pvVar1 = memchr(src,0x40,__n_00);
        if (pvVar1 != (void *)0x0) {
          pvVar1 = Curl_memdup0(src,__n_00);
          (conn_00->proto).imapc.dyn.toobig = (size_t)pvVar1;
          if ((conn_00->proto).imapc.dyn.toobig == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          (conn_00->proto).pop3c.authtypes = (conn_00->proto).pop3c.authtypes | 2;
        }
      }
      conn._4_4_ = pop3_perform_capa(data,conn_00);
    }
  }
  else {
    Curl_failf(data,"Got unexpected pop3-server response");
    conn._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return conn._4_4_;
}

Assistant:

static CURLcode pop3_state_servergreet_resp(struct Curl_easy *data,
                                            int pop3code,
                                            pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = Curl_dyn_ptr(&data->conn->proto.pop3c.pp.recvbuf);
  size_t len = data->conn->proto.pop3c.pp.nfinal;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Got unexpected pop3-server response");
    result = CURLE_WEIRD_SERVER_REPLY;
  }
  else if(len > 3) {
    /* Does the server support APOP authentication? */
    char *lt;
    char *gt = NULL;

    /* Look for the APOP timestamp */
    lt = memchr(line, '<', len);
    if(lt)
      /* search the remainder for '>' */
      gt = memchr(lt, '>', len - (lt - line));
    if(gt) {
      /* the length of the timestamp, including the brackets */
      size_t timestamplen = gt - lt + 1;
      char *at = memchr(lt, '@', timestamplen);
      /* If the timestamp does not contain '@' it is not (as required by
         RFC-1939) conformant to the RFC-822 message id syntax, and we
         therefore do not use APOP authentication. */
      if(at) {
        /* dupe the timestamp */
        pop3c->apoptimestamp = Curl_memdup0(lt, timestamplen);
        if(!pop3c->apoptimestamp)
          return CURLE_OUT_OF_MEMORY;
        /* Store the APOP capability */
        pop3c->authtypes |= POP3_TYPE_APOP;
      }
    }

    if(!result)
      result = pop3_perform_capa(data, conn);
  }

  return result;
}